

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_MaxPlayerAmmo(FParser *this)

{
  bool bVar1;
  int iVar2;
  PClassAmmo *type;
  AInventory *pAVar3;
  AActor *pAVar4;
  AInventory *iammo;
  AInventory *item;
  AAmmo *iammo_1;
  PClassAmmo *ammotype;
  int amount;
  int playernum;
  FParser *this_local;
  
  bVar1 = CheckArgs(this,2);
  if (((bVar1) && (iVar2 = T_GetPlayerNum(this->t_argv), iVar2 != -1)) &&
     (type = T_GetAmmo(this->t_argv + 1), type != (PClassAmmo *)0x0)) {
    if ((this->t_argc != 2) && (2 < this->t_argc)) {
      item = AActor::FindInventory
                       ((AActor *)(&players)[(long)iVar2 * 0x54],(PClassActor *)type,false);
      ammotype._0_4_ = intvalue(this->t_argv + 2);
      if ((int)ammotype < 0) {
        ammotype._0_4_ = 0;
      }
      if (item == (AInventory *)0x0) {
        item = (AInventory *)Spawn((PClassActor *)type);
        item->Amount = 0;
        (*(item->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x29])
                  (item,(&players)[(long)iVar2 * 0x54]);
      }
      item->MaxAmount = (int)ammotype;
      for (iammo = ::TObjPtr::operator_cast_to_AInventory_
                             ((TObjPtr *)((&players)[(long)iVar2 * 0x54] + 0x3b0));
          iammo != (AInventory *)0x0;
          iammo = ::TObjPtr::operator_cast_to_AInventory_
                            ((TObjPtr *)&(iammo->super_AActor).Inventory)) {
        bVar1 = DObject::IsKindOf((DObject *)iammo,ABackpackItem::RegistrationInfo.MyClass);
        if (bVar1) {
          if (this->t_argc < 4) {
            ammotype._0_4_ = (int)ammotype << 1;
          }
          else {
            ammotype._0_4_ = intvalue(this->t_argv + 3);
          }
          break;
        }
      }
      *(int *)&item[1].super_AActor.super_DThinker.super_DObject._vptr_DObject = (int)ammotype;
    }
    (this->t_return).type = 1;
    pAVar3 = AActor::FindInventory
                       ((AActor *)(&players)[(long)iVar2 * 0x54],(PClassActor *)type,false);
    if (pAVar3 == (AInventory *)0x0) {
      pAVar4 = GetDefaultByType((PClass *)type);
      (this->t_return).value.i = *(int *)((long)&pAVar4[1].super_DThinker.super_DObject.Class + 4);
    }
    else {
      (this->t_return).value.i = pAVar3->MaxAmount;
    }
  }
  return;
}

Assistant:

void FParser::SF_MaxPlayerAmmo()
{
	int playernum, amount;
	PClassAmmo * ammotype;

	if (CheckArgs(2))
	{
		playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum==-1) return;

		ammotype=T_GetAmmo(t_argv[1]);
		if (!ammotype) return;

		if(t_argc == 2)
		{
		}
		else if(t_argc >= 3)
		{
			AAmmo * iammo = (AAmmo*)players[playernum].mo->FindInventory(ammotype);
			amount = intvalue(t_argv[2]);
			if(amount < 0) amount = 0;
			if (!iammo) 
			{
				iammo = static_cast<AAmmo *>(Spawn (ammotype));
				iammo->Amount = 0;
				iammo->AttachToOwner (players[playernum].mo);
			}
			iammo->MaxAmount = amount;


			for (AInventory *item = players[playernum].mo->Inventory; item != NULL; item = item->Inventory)
			{
				if (item->IsKindOf(RUNTIME_CLASS(ABackpackItem)))
				{
					if (t_argc>=4) amount = intvalue(t_argv[3]);
					else amount*=2;
					break;
				}
			}
			iammo->BackpackMaxAmount=amount;
		}

		t_return.type = svt_int;
		AInventory * iammo = players[playernum].mo->FindInventory(ammotype);
		if (iammo) t_return.value.i = iammo->MaxAmount;
		else t_return.value.i = ((AAmmo*)GetDefaultByType(ammotype))->MaxAmount;
	}
}